

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

st_quicly_sent_block_t ** free_block(quicly_sentmap_t *map,st_quicly_sent_block_t **ref)

{
  st_quicly_sent_block_t *__ptr;
  st_quicly_sent_block_t *in_RSI;
  st_quicly_sent_block_t *in_RDI;
  st_quicly_sent_block_t *block;
  st_quicly_sent_block_t *local_10;
  
  __ptr = in_RSI->next;
  if (__ptr->next == (st_quicly_sent_block_t *)0x0) {
    if (__ptr != (st_quicly_sent_block_t *)in_RDI->num_entries) {
      __assert_fail("block == map->tail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                    ,0x38,
                    "struct st_quicly_sent_block_t **free_block(quicly_sentmap_t *, struct st_quicly_sent_block_t **)"
                   );
    }
    if (in_RSI == in_RDI) {
      in_RDI->next = (st_quicly_sent_block_t *)0x0;
      in_RDI->num_entries = 0;
    }
    else {
      in_RDI->num_entries = (size_t)in_RSI;
      ((st_quicly_sent_block_t *)in_RDI->num_entries)->next = (st_quicly_sent_block_t *)0x0;
    }
    local_10 = (st_quicly_sent_block_t *)&free_block::dummy_ref;
  }
  else {
    in_RSI->next = __ptr->next;
    local_10 = in_RSI;
    if (*(long *)((long)in_RSI->next + 8) == 0) {
      __assert_fail("(*ref)->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                    ,0x36,
                    "struct st_quicly_sent_block_t **free_block(quicly_sentmap_t *, struct st_quicly_sent_block_t **)"
                   );
    }
  }
  free(__ptr);
  return &local_10->next;
}

Assistant:

static struct st_quicly_sent_block_t **free_block(quicly_sentmap_t *map, struct st_quicly_sent_block_t **ref)
{
    static const struct st_quicly_sent_block_t dummy = {NULL};
    static const struct st_quicly_sent_block_t *const dummy_ref = &dummy;
    struct st_quicly_sent_block_t *block = *ref;

    if (block->next != NULL) {
        *ref = block->next;
        assert((*ref)->num_entries != 0);
    } else {
        assert(block == map->tail);
        if (ref == &map->head) {
            map->head = NULL;
            map->tail = NULL;
        } else {
            map->tail = (void *)((char *)ref - offsetof(struct st_quicly_sent_block_t, next));
            map->tail->next = NULL;
        }
        ref = (struct st_quicly_sent_block_t **)&dummy_ref;
    }

    free(block);
    return ref;
}